

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O0

int Gia_Iso2ManCheckIsoClassOneSkip
              (Gia_Man_t *p,Vec_Int_t *vClass,Vec_Int_t *vRoots,Vec_Int_t *vVec0,Vec_Int_t *vVec1,
              Vec_Int_t *vMap0,Vec_Int_t *vMap1)

{
  int iVar1;
  int iVar2;
  int local_48;
  int local_44;
  int iPo;
  int i;
  Vec_Int_t *vMap0_local;
  Vec_Int_t *vVec1_local;
  Vec_Int_t *vVec0_local;
  Vec_Int_t *vRoots_local;
  Vec_Int_t *vClass_local;
  Gia_Man_t *p_local;
  
  _iPo = vMap0;
  vMap0_local = vVec1;
  vVec1_local = vVec0;
  vVec0_local = vRoots;
  vRoots_local = vClass;
  vClass_local = (Vec_Int_t *)p;
  iVar1 = Vec_IntSize(vClass);
  if (iVar1 < 2) {
    __assert_fail("Vec_IntSize(vClass) > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso2.c"
                  ,0x22c,
                  "int Gia_Iso2ManCheckIsoClassOneSkip(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  local_48 = Vec_IntEntry(vRoots_local,0);
  Gia_Iso2ManCollectOrder((Gia_Man_t *)vClass_local,&local_48,1,vVec0_local,vVec1_local,_iPo);
  local_44 = 1;
  while( true ) {
    iVar1 = local_44;
    iVar2 = Vec_IntSize(vRoots_local);
    if (iVar2 <= iVar1) {
      return 1;
    }
    local_48 = Vec_IntEntry(vRoots_local,local_44);
    Gia_Iso2ManCollectOrder((Gia_Man_t *)vClass_local,&local_48,1,vVec0_local,vMap0_local,vMap1);
    iVar1 = Vec_IntSize(vVec1_local);
    iVar2 = Vec_IntSize(vMap0_local);
    if (iVar1 != iVar2) break;
    iVar1 = Gia_Iso2ManCheckIsoPair((Gia_Man_t *)vClass_local,vVec1_local,vMap0_local,_iPo,vMap1);
    if (iVar1 == 0) {
      return 0;
    }
    local_44 = local_44 + 1;
  }
  return 0;
}

Assistant:

int Gia_Iso2ManCheckIsoClassOneSkip( Gia_Man_t * p, Vec_Int_t * vClass, Vec_Int_t * vRoots, Vec_Int_t * vVec0, Vec_Int_t * vVec1, Vec_Int_t * vMap0, Vec_Int_t * vMap1 )
{
    int i, iPo;
    assert( Vec_IntSize(vClass) > 1 );
    iPo = Vec_IntEntry( vClass, 0 );
    Gia_Iso2ManCollectOrder( p, &iPo, 1, vRoots, vVec0, vMap0 );
    Vec_IntForEachEntryStart( vClass, iPo, i, 1 )
    {
        Gia_Iso2ManCollectOrder( p, &iPo, 1, vRoots, vVec1, vMap1 );
        if ( Vec_IntSize(vVec0) != Vec_IntSize(vVec1) )
            return 0;
        if ( !Gia_Iso2ManCheckIsoPair( p, vVec0, vVec1, vMap0, vMap1 ) )
            return 0;
    }
    return 1;
}